

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

Compiler * __thiscall
spirv_cross::Compiler::get_block_fallback_name_abi_cxx11_(Compiler *this,VariableID id)

{
  uint32_t uVar1;
  ulong uVar2;
  SPIRType *pSVar3;
  string *psVar4;
  undefined4 in_register_00000034;
  Compiler *this_00;
  ID local_30;
  ID local_2c;
  SPIRVariable *local_28;
  SPIRVariable *var;
  Compiler *this_local;
  Compiler *pCStack_10;
  VariableID id_local;
  
  this_00 = (Compiler *)CONCAT44(in_register_00000034,id.id);
  var = (SPIRVariable *)this_00;
  pCStack_10 = this;
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  local_28 = get<spirv_cross::SPIRVariable>(this_00,uVar1);
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
            (&local_2c,(TypedID<(spirv_cross::Types)2> *)((long)&this_local + 4));
  get_name_abi_cxx11_(this_00,local_2c);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
              (&local_30,(TypedID<(spirv_cross::Types)2> *)((long)&this_local + 4));
    psVar4 = get_name_abi_cxx11_(this_00,local_30);
    ::std::__cxx11::string::string((string *)this,(string *)psVar4);
  }
  else {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_28->super_IVariant).field_0xc)
    ;
    pSVar3 = get<spirv_cross::SPIRType>(this_00,uVar1);
    join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)2>&>
              ((spirv_cross *)this,(char (*) [2])0x40fecd,&(pSVar3->super_IVariant).self,
               (char (*) [2])0x40fecd,(TypedID<(spirv_cross::Types)2> *)((long)&this_local + 4));
  }
  return this;
}

Assistant:

const std::string Compiler::get_block_fallback_name(VariableID id) const
{
	auto &var = get<SPIRVariable>(id);
	if (get_name(id).empty())
		return join("_", get<SPIRType>(var.basetype).self, "_", id);
	else
		return get_name(id);
}